

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sgen4.c
# Opt level: O0

void firstSatGroup(int g,int sign)

{
  long lVar1;
  int in_ESI;
  int in_EDI;
  int j;
  int i;
  int local_10;
  int local_c;
  
  for (local_c = 1; local_10 = local_c, local_c < groupSize; local_c = local_c + 1) {
    while (local_10 = local_10 + 1, local_10 <= groupSize) {
      lVar1 = (long)clauseCount;
      clauseCount = clauseCount + 1;
      set2Clause(clauseArray + lVar1,in_ESI * permute[in_EDI * groupSize + local_c],
                 in_ESI * permute[in_EDI * groupSize + local_10]);
    }
  }
  return;
}

Assistant:

void firstSatGroup (int g, int sign)
{
    int i,j;

    for (i=1;i<groupSize;i++)
        for (j=i+1;j<=groupSize;j++)
            set2Clause (&(clauseArray[clauseCount++]), sign*permute[g*groupSize+i], sign*permute[g*groupSize+j]);

}